

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  FILE *pFVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  BinarySource *__s;
  size_t len;
  strbuf *out;
  bool bVar7;
  ptrlen data;
  ulong local_a0;
  size_t i;
  size_t lines;
  strbuf *sb;
  undefined1 local_78 [8];
  BinarySource src [1];
  char *line;
  FILE *outfp;
  FILE *infp;
  char *p;
  char *pcStack_28;
  _Bool doing_opts;
  char *outfile;
  char *infile;
  char **argv_local;
  int argc_local;
  
  outfile = (char *)0x0;
  pcStack_28 = (char *)0x0;
  bVar1 = true;
  infile = (char *)argv;
  argv_local._0_4_ = argc;
  while (iVar3 = (int)argv_local + -1, 0 < iVar3) {
    pcVar6 = *(char **)(infile + 8);
    if ((*pcVar6 == '-') && (bVar1)) {
      iVar4 = strcmp(pcVar6,"-o");
      if (iVar4 == 0) {
        if ((int)argv_local + -2 < 1) {
          fprintf(_stderr,"\'-o\' expects a filename\n");
          return 1;
        }
        pcStack_28 = *(char **)(infile + 0x10);
        infile = infile + 0x10;
        argv_local._0_4_ = (int)argv_local + -2;
      }
      else {
        iVar4 = strcmp(pcVar6,"--");
        if (iVar4 != 0) {
          iVar3 = strcmp(pcVar6,"--help");
          if (iVar3 == 0) {
            printf("usage: testcrypt [INFILE] [-o OUTFILE]\n");
            printf(" also: testcrypt --help       display this text\n");
            return 0;
          }
          fprintf(_stderr,"unknown command line option \'%s\'\n",pcVar6);
          return 1;
        }
        bVar1 = false;
        infile = infile + 8;
        argv_local._0_4_ = iVar3;
      }
    }
    else {
      bVar7 = outfile != (char *)0x0;
      outfile = pcVar6;
      infile = infile + 8;
      argv_local._0_4_ = iVar3;
      if (bVar7) {
        fprintf(_stderr,"can only handle one input file name\n");
        return 1;
      }
    }
  }
  outfp = _stdin;
  if ((outfile != (char *)0x0) &&
     (outfp = (FILE *)fopen(outfile,"r"), pFVar2 = _stderr, (FILE *)outfp == (FILE *)0x0)) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(pFVar2,"%s: open: %s\n",outfile,pcVar6);
    return 1;
  }
  line = _stdout;
  if ((pcStack_28 != (char *)0x0) &&
     (line = (char *)fopen(pcStack_28,"w"), pFVar2 = _stderr, (FILE *)line == (FILE *)0x0)) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(pFVar2,"%s: open: %s\n",pcStack_28,pcVar6);
    return 1;
  }
  values = newtree234(valuecmp);
  atexit(free_all_values);
  while( true ) {
    pcVar6 = fgetline(outfp);
    __s = (BinarySource *)chomp(pcVar6);
    src[0].binarysource_ = __s;
    if (__s == (BinarySource *)0x0) break;
    len = strlen((char *)__s);
    data = make_ptrlen(__s,len);
    BinarySource_INIT__((BinarySource *)local_78,data);
    out = strbuf_new();
    process_line((BinarySource *)local_78,out);
    run_finalisers(out);
    i = 0;
    for (local_a0 = 0; local_a0 < out->len; local_a0 = local_a0 + 1) {
      if (out->s[local_a0] == '\n') {
        i = i + 1;
      }
    }
    fprintf((FILE *)line,"%zu\n%s",i,out->s);
    fflush((FILE *)line);
    strbuf_free(out);
    safefree(src[0].binarysource_);
  }
  if (outfp != _stdin) {
    fclose((FILE *)outfp);
  }
  if ((FILE *)line != _stdin) {
    fclose((FILE *)line);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    const char *infile = NULL, *outfile = NULL;
    bool doing_opts = true;

    while (--argc > 0) {
        char *p = *++argv;

        if (p[0] == '-' && doing_opts) {
            if (!strcmp(p, "-o")) {
                if (--argc <= 0) {
                    fprintf(stderr, "'-o' expects a filename\n");
                    return 1;
                }
                outfile = *++argv;
            } else if (!strcmp(p, "--")) {
                doing_opts = false;
            } else if (!strcmp(p, "--help")) {
                printf("usage: testcrypt [INFILE] [-o OUTFILE]\n");
                printf(" also: testcrypt --help       display this text\n");
                return 0;
            } else {
                fprintf(stderr, "unknown command line option '%s'\n", p);
                return 1;
            }
        } else if (!infile) {
            infile = p;
        } else {
            fprintf(stderr, "can only handle one input file name\n");
            return 1;
        }
    }

    FILE *infp = stdin;
    if (infile) {
        infp = fopen(infile, "r");
        if (!infp) {
            fprintf(stderr, "%s: open: %s\n", infile, strerror(errno));
            return 1;
        }
    }

    FILE *outfp = stdout;
    if (outfile) {
        outfp = fopen(outfile, "w");
        if (!outfp) {
            fprintf(stderr, "%s: open: %s\n", outfile, strerror(errno));
            return 1;
        }
    }

    values = newtree234(valuecmp);

    atexit(free_all_values);

    for (char *line; (line = chomp(fgetline(infp))) != NULL ;) {
        BinarySource src[1];
        BinarySource_BARE_INIT(src, line, strlen(line));
        strbuf *sb = strbuf_new();
        process_line(src, sb);
        run_finalisers(sb);
        size_t lines = 0;
        for (size_t i = 0; i < sb->len; i++)
            if (sb->s[i] == '\n')
                lines++;
        fprintf(outfp, "%"SIZEu"\n%s", lines, sb->s);
        fflush(outfp);
        strbuf_free(sb);
        sfree(line);
    }

    if (infp != stdin)
        fclose(infp);
    if (outfp != stdin)
        fclose(outfp);

    return 0;
}